

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cComputeShaderTests.cpp
# Opt level: O3

bool __thiscall
glcts::anon_unknown_0::BasicSharedStruct::RunIteration
          (BasicSharedStruct *this,bool dispatch_indirect)

{
  GLuint *buffers;
  CallLogWrapper *this_00;
  undefined1 auVar1 [16];
  uint uVar2;
  void *__s;
  float *pfVar3;
  float *extraout_RAX;
  GLuint GVar4;
  bool bVar5;
  ulong uVar6;
  float *pfVar7;
  float fVar8;
  GLuint groups [3];
  undefined1 *local_40;
  undefined4 local_38;
  
  __s = operator_new(0x1000);
  memset(__s,0,0x1000);
  buffers = &this->m_storage_buffer;
  GVar4 = this->m_storage_buffer;
  if (GVar4 == 0) {
    glu::CallLogWrapper::glGenBuffers
              (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,1,buffers);
    GVar4 = *buffers;
  }
  this_00 = &(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper;
  glu::CallLogWrapper::glBindBufferBase(this_00,0x90d2,0,GVar4);
  glu::CallLogWrapper::glBufferData(this_00,0x90d2,0x1000,__s,0x88e8);
  glu::CallLogWrapper::glBindBuffer(this_00,0x90d2,0);
  glu::CallLogWrapper::glUseProgram(this_00,this->m_program);
  if (dispatch_indirect) {
    local_40 = &DAT_100000001;
    local_38 = 1;
    GVar4 = this->m_dispatch_buffer;
    if (GVar4 == 0) {
      glu::CallLogWrapper::glGenBuffers(this_00,1,&this->m_dispatch_buffer);
      GVar4 = this->m_dispatch_buffer;
    }
    glu::CallLogWrapper::glBindBuffer(this_00,0x90ee,GVar4);
    glu::CallLogWrapper::glBufferData(this_00,0x90ee,0xc,&local_40,0x88e4);
    glu::CallLogWrapper::glDispatchComputeIndirect(this_00,0);
  }
  else {
    glu::CallLogWrapper::glDispatchCompute(this_00,1,1,1);
  }
  glu::CallLogWrapper::glBindBuffer(this_00,0x90d2,*buffers);
  glu::CallLogWrapper::glMemoryBarrier(this_00,0x200);
  pfVar3 = (float *)glu::CallLogWrapper::glMapBufferRange(this_00,0x90d2,0,0x1000,1);
  bVar5 = true;
  uVar6 = 0;
  pfVar7 = pfVar3;
  do {
    fVar8 = (float)(int)uVar6;
    auVar1._4_4_ = -(uint)(pfVar7[1] == fVar8);
    auVar1._0_4_ = -(uint)(*pfVar7 == fVar8);
    auVar1._8_4_ = -(uint)(pfVar7[2] == fVar8);
    auVar1._12_4_ = -(uint)(pfVar7[3] == fVar8);
    uVar2 = movmskps((int)pfVar3,auVar1);
    pfVar3 = (float *)(ulong)uVar2;
    if (uVar2 != 0xf) {
      bVar5 = false;
      anon_unknown_0::Output("Invalid data at index %d.\n",uVar6 & 0xffffffff);
      pfVar3 = extraout_RAX;
    }
    uVar6 = uVar6 + 1;
    pfVar7 = pfVar7 + 4;
  } while (uVar6 != 0x100);
  glu::CallLogWrapper::glUnmapBuffer(this_00,0x90d2);
  glu::CallLogWrapper::glBindBuffer(this_00,0x90d2,0);
  operator_delete(__s,0x1000);
  return bVar5;
}

Assistant:

bool RunIteration(bool dispatch_indirect)
	{
		const GLuint kBufferSize = 256;

		std::vector<vec4> data(kBufferSize);
		if (m_storage_buffer == 0)
			glGenBuffers(1, &m_storage_buffer);
		glBindBufferBase(GL_SHADER_STORAGE_BUFFER, 0, m_storage_buffer);
		glBufferData(GL_SHADER_STORAGE_BUFFER, sizeof(vec4) * kBufferSize, &data[0], GL_DYNAMIC_DRAW);
		glBindBuffer(GL_SHADER_STORAGE_BUFFER, 0);

		glUseProgram(m_program);
		if (dispatch_indirect)
		{
			const GLuint groups[3] = { 1, 1, 1 };
			if (m_dispatch_buffer == 0)
				glGenBuffers(1, &m_dispatch_buffer);
			glBindBuffer(GL_DISPATCH_INDIRECT_BUFFER, m_dispatch_buffer);
			glBufferData(GL_DISPATCH_INDIRECT_BUFFER, sizeof(groups), groups, GL_STATIC_DRAW);
			glDispatchComputeIndirect(0);
		}
		else
		{
			glDispatchCompute(1, 1, 1);
		}

		glBindBuffer(GL_SHADER_STORAGE_BUFFER, m_storage_buffer);
		glMemoryBarrier(GL_BUFFER_UPDATE_BARRIER_BIT);
		vec4* result;
		result = static_cast<vec4*>(
			glMapBufferRange(GL_SHADER_STORAGE_BUFFER, 0, sizeof(vec4) * kBufferSize, GL_MAP_READ_BIT));
		bool res = true;
		for (GLuint i = 0; i < kBufferSize; ++i)
		{
			if (!IsEqual(result[i], vec4(static_cast<float>(i))))
			{
				Output("Invalid data at index %d.\n", i);
				res = false;
			}
		}
		glUnmapBuffer(GL_SHADER_STORAGE_BUFFER);
		glBindBuffer(GL_SHADER_STORAGE_BUFFER, 0);
		return res;
	}